

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# makePreview.cpp
# Opt level: O0

void makePreview(char *inFileName,char *outFileName,int previewWidth,float exposure,bool verbose)

{
  byte bVar1;
  byte bVar2;
  int iVar3;
  ostream *poVar4;
  Header *pHVar5;
  PreviewRgba *pPVar6;
  byte in_CL;
  uint in_EDX;
  char *in_RSI;
  char *in_RDI;
  OutputFile out_1;
  TiledOutputFile out;
  Header header;
  InputFile in;
  int previewHeight;
  Array2D<Imf_3_4::PreviewRgba> previewPixels;
  Array2D<Imf_3_4::PreviewRgba> *in_stack_fffffffffffffea0;
  OutputFile local_e8 [16];
  TiledOutputFile local_d8 [32];
  PreviewImage local_b8 [16];
  Header local_a8 [56];
  InputFile local_70 [40];
  Array2D<Imf_3_4::PreviewRgba> *in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffc0;
  uint in_stack_ffffffffffffffc4;
  int in_stack_ffffffffffffffc8;
  float in_stack_ffffffffffffffcc;
  char *in_stack_ffffffffffffffd0;
  
  bVar1 = in_CL & 1;
  if (bVar1 != 0) {
    poVar4 = std::operator<<((ostream *)&std::cout,"generating preview image");
    std::ostream::operator<<((ostream *)poVar4,std::endl<char,std::char_traits<char>>);
  }
  Imf_3_4::Array2D<Imf_3_4::PreviewRgba>::Array2D
            ((Array2D<Imf_3_4::PreviewRgba> *)&stack0xffffffffffffffc8);
  anon_unknown.dwarf_4d39::generatePreview
            (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8,
             (int *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
             in_stack_ffffffffffffffb8);
  iVar3 = Imf_3_4::globalThreadCount();
  Imf_3_4::InputFile::InputFile(local_70,in_RDI,iVar3);
  pHVar5 = (Header *)Imf_3_4::InputFile::header();
  Imf_3_4::Header::Header(local_a8,pHVar5);
  pPVar6 = Imf_3_4::Array2D<Imf_3_4::PreviewRgba>::operator[]
                     ((Array2D<Imf_3_4::PreviewRgba> *)&stack0xffffffffffffffc8,0);
  Imf_3_4::PreviewImage::PreviewImage(local_b8,in_EDX,in_stack_ffffffffffffffc4,pPVar6);
  Imf_3_4::Header::setPreviewImage((PreviewImage *)local_a8);
  Imf_3_4::PreviewImage::~PreviewImage(local_b8);
  if (bVar1 != 0) {
    poVar4 = std::operator<<((ostream *)&std::cout,"copying ");
    poVar4 = std::operator<<(poVar4,in_RDI);
    poVar4 = std::operator<<(poVar4," to ");
    poVar4 = std::operator<<(poVar4,in_RSI);
    std::ostream::operator<<((ostream *)poVar4,std::endl<char,std::char_traits<char>>);
  }
  bVar2 = Imf_3_4::Header::hasTileDescription();
  if ((bVar2 & 1) == 0) {
    iVar3 = Imf_3_4::globalThreadCount();
    Imf_3_4::OutputFile::OutputFile(local_e8,in_RSI,local_a8,iVar3);
    Imf_3_4::OutputFile::copyPixels((InputFile *)local_e8);
    Imf_3_4::OutputFile::~OutputFile(local_e8);
  }
  else {
    iVar3 = Imf_3_4::globalThreadCount();
    Imf_3_4::TiledOutputFile::TiledOutputFile(local_d8,in_RSI,local_a8,iVar3);
    Imf_3_4::TiledOutputFile::copyPixels((InputFile *)local_d8);
    Imf_3_4::TiledOutputFile::~TiledOutputFile(local_d8);
  }
  if (bVar1 != 0) {
    in_stack_fffffffffffffea0 =
         (Array2D<Imf_3_4::PreviewRgba> *)std::operator<<((ostream *)&std::cout,"done.");
    std::ostream::operator<<
              ((ostream *)in_stack_fffffffffffffea0,std::endl<char,std::char_traits<char>>);
  }
  Imf_3_4::Header::~Header(local_a8);
  Imf_3_4::InputFile::~InputFile((InputFile *)in_stack_fffffffffffffea0);
  Imf_3_4::Array2D<Imf_3_4::PreviewRgba>::~Array2D(in_stack_fffffffffffffea0);
  return;
}

Assistant:

void
makePreview (
    const char inFileName[],
    const char outFileName[],
    int        previewWidth,
    float      exposure,
    bool       verbose)
{
    if (verbose) cout << "generating preview image" << endl;

    Array2D<PreviewRgba> previewPixels;
    int                  previewHeight;

    generatePreview (
        inFileName, exposure, previewWidth, previewHeight, previewPixels);

    InputFile in (inFileName);
    Header    header = in.header ();

    header.setPreviewImage (
        PreviewImage (previewWidth, previewHeight, &previewPixels[0][0]));

    if (verbose)
        cout << "copying " << inFileName << " to " << outFileName << endl;

    if (header.hasTileDescription ())
    {
        TiledOutputFile out (outFileName, header);
        out.copyPixels (in);
    }
    else
    {
        OutputFile out (outFileName, header);
        out.copyPixels (in);
    }

    if (verbose) cout << "done." << endl;
}